

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  int *piVar10;
  BYTE *pBVar11;
  long lVar12;
  ulong uVar13;
  int *ip;
  int *piVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  int *piVar17;
  ulong uVar18;
  seqDef *psVar19;
  uint local_cc;
  size_t offbaseFound;
  uint local_b4;
  ulong local_b0;
  ZSTD_matchState_t *local_a8;
  uint local_9c;
  int *local_98;
  BYTE *local_90;
  int *local_88;
  ulong local_80;
  BYTE *local_78;
  seqStore_t *local_70;
  int *local_68;
  BYTE *local_60;
  int *local_58;
  int *local_50;
  BYTE *local_48;
  BYTE *local_40;
  uint *local_38;
  
  local_78 = (ms->window).base;
  local_9c = (ms->window).dictLimit;
  local_b0 = (ulong)local_9c;
  uVar4 = (ms->cParams).minMatch;
  uVar5 = 6;
  if (uVar4 < 6) {
    uVar5 = uVar4;
  }
  uVar4 = 4;
  if (4 < uVar5) {
    uVar4 = uVar5;
  }
  local_90 = local_78 + local_b0;
  local_cc = *rep;
  pZVar2 = ms->dictMatchState;
  local_88 = (int *)(pZVar2->window).nextSrc;
  local_60 = (pZVar2->window).base;
  local_40 = local_60 + (pZVar2->window).dictLimit;
  uVar5 = ((int)src - ((int)local_90 + (int)local_40)) + (int)local_88;
  ip = (int *)((long)src + (ulong)(uVar5 == 0));
  if (uVar5 < local_cc) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x603,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_b4 = rep[1];
  if (uVar5 < local_b4) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_lazy.c"
                  ,0x604,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_58 = (int *)((long)src + (srcSize - 8));
  local_9c = ((int)local_60 - (int)local_88) + local_9c;
  ms->lazySkipping = 0;
  local_48 = local_60 + -(ulong)local_9c;
  local_50 = iEnd + -8;
  uVar5 = local_b4;
  local_a8 = ms;
  piVar10 = (int *)src;
  local_70 = seqStore;
  local_38 = rep;
  do {
    while( true ) {
      local_98 = piVar10;
      local_b4 = uVar5;
      if (local_58 <= ip) {
        *local_38 = local_cc;
        local_38[1] = local_b4;
        return (long)iEnd - (long)local_98;
      }
      uVar5 = (((int)ip - (int)local_78) - local_cc) + 1;
      piVar10 = (int *)(local_78 + uVar5);
      if (uVar5 < (uint)local_b0) {
        piVar10 = (int *)(local_60 + (uVar5 - local_9c));
      }
      if ((uVar5 - (uint)local_b0 < 0xfffffffd) && (*piVar10 == *(int *)((long)ip + 1))) {
        piVar17 = iEnd;
        if (uVar5 < (uint)local_b0) {
          piVar17 = local_88;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar10 + 1),(BYTE *)iEnd,(BYTE *)piVar17
                           ,local_90);
        uVar13 = sVar7 + 4;
      }
      else {
        uVar13 = 0;
      }
      offbaseFound = 999999999;
      if (uVar4 == 6) {
        uVar8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound)
        ;
      }
      else if (uVar4 == 5) {
        uVar8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound)
        ;
      }
      else {
        uVar8 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4(ms,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound)
        ;
      }
      uVar9 = uVar13;
      if (uVar13 < uVar8) {
        uVar9 = uVar8;
      }
      if (3 < uVar9) break;
      uVar13 = (long)ip - (long)local_98;
      ip = (int *)((long)ip + (uVar13 >> 8) + 1);
      ms->lazySkipping = (uint)(0x7ff < uVar13);
      uVar5 = local_b4;
      piVar10 = local_98;
    }
    uVar18 = 1;
    piVar10 = (int *)((long)ip + 1);
    if (uVar13 < uVar8) {
      piVar10 = ip;
      uVar18 = offbaseFound;
    }
    while (uVar8 = uVar9, piVar14 = ip, piVar17 = piVar10, uVar13 = uVar18, piVar14 < local_58) {
      ip = (int *)((long)piVar14 + 1);
      uVar5 = ((int)ip - (int)local_78) - local_cc;
      piVar17 = (int *)(local_78 + uVar5);
      if (uVar5 < (uint)local_b0) {
        piVar17 = (int *)(local_60 + (uVar5 - local_9c));
      }
      local_68 = piVar10;
      if ((uVar5 - (uint)local_b0 < 0xfffffffd) && (*piVar17 == *ip)) {
        piVar10 = iEnd;
        if (uVar5 < (uint)local_b0) {
          piVar10 = local_88;
        }
        sVar7 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar14 + 5),(BYTE *)(piVar17 + 1),(BYTE *)iEnd,
                           (BYTE *)piVar10,local_90);
        uVar5 = ZSTD_highbit32((U32)uVar18);
        if ((sVar7 < 0xfffffffffffffffc) &&
           ((int)(((int)uVar8 * 3 - uVar5) + 1) < (int)(sVar7 + 4) * 3)) {
          uVar18 = 1;
          uVar8 = sVar7 + 4;
          local_68 = ip;
        }
      }
      offbaseFound = 999999999;
      local_80 = uVar18;
      if (uVar4 == 6) {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                          (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else if (uVar4 == 5) {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                          (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                          (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
      }
      uVar18 = offbaseFound;
      uVar5 = ZSTD_highbit32((U32)offbaseFound);
      uVar6 = ZSTD_highbit32((U32)local_80);
      seqStore = local_70;
      if ((uVar9 < 4) ||
         (piVar10 = ip, (int)((int)uVar9 * 4 - uVar5) <= (int)(((int)uVar8 * 4 - uVar6) + 4))) {
        piVar17 = local_68;
        uVar13 = local_80;
        if (local_58 <= ip) break;
        ip = (int *)((long)piVar14 + 2);
        uVar5 = ((int)ip - (int)local_78) - local_cc;
        piVar10 = (int *)(local_78 + uVar5);
        if (uVar5 < (uint)local_b0) {
          piVar10 = (int *)(local_60 + (uVar5 - local_9c));
        }
        if ((uVar5 - (uint)local_b0 < 0xfffffffd) && (*piVar10 == *ip)) {
          piVar17 = iEnd;
          if (uVar5 < (uint)local_b0) {
            piVar17 = local_88;
          }
          sVar7 = ZSTD_count_2segments
                            ((BYTE *)((long)piVar14 + 6),(BYTE *)(piVar10 + 1),(BYTE *)iEnd,
                             (BYTE *)piVar17,local_90);
          uVar5 = ZSTD_highbit32((U32)local_80);
          if ((sVar7 < 0xfffffffffffffffc) &&
             ((int)(((int)uVar8 * 4 + 1) - uVar5) < (int)(sVar7 + 4) * 4)) {
            local_80 = 1;
            uVar8 = sVar7 + 4;
            local_68 = ip;
          }
        }
        offbaseFound = 999999999;
        if (uVar4 == 6) {
          uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_6
                            (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
        }
        else if (uVar4 == 5) {
          uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_5
                            (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar9 = ZSTD_HcFindBestMatch_dedicatedDictSearch_4
                            (local_a8,(BYTE *)ip,(BYTE *)iEnd,&offbaseFound);
        }
        uVar18 = offbaseFound;
        uVar5 = ZSTD_highbit32((U32)offbaseFound);
        uVar13 = local_80;
        uVar6 = ZSTD_highbit32((U32)local_80);
        piVar17 = local_68;
        seqStore = local_70;
        if ((uVar9 < 4) ||
           (piVar10 = ip, (int)((int)uVar9 * 4 - uVar5) <= (int)(((int)uVar8 * 4 - uVar6) + 7)))
        break;
      }
    }
    if (3 < uVar13) {
      pBVar11 = (BYTE *)((long)piVar17 + (-(long)local_78 - uVar13) + -0xfffffffd);
      pBVar15 = local_78;
      pBVar16 = local_90;
      if ((uint)pBVar11 < (uint)local_b0) {
        pBVar15 = local_48;
        pBVar16 = local_40;
      }
      pBVar15 = pBVar15 + ((ulong)pBVar11 & 0xffffffff);
      for (; ((local_98 < piVar17 && (pBVar16 < pBVar15)) &&
             (*(BYTE *)((long)piVar17 + -1) == pBVar15[-1])); piVar17 = (int *)((long)piVar17 + -1))
      {
        pBVar15 = pBVar15 + -1;
        uVar8 = uVar8 + 1;
      }
      local_b4 = local_cc;
      local_cc = (U32)uVar13 - 3;
    }
    if (seqStore->maxNbSeq <=
        (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)) {
LAB_001c6e66:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < seqStore->maxNbLit) {
LAB_001c6e85:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x29f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar9 = (long)piVar17 - (long)local_98;
    pBVar16 = seqStore->lit;
    if (seqStore->litStart + seqStore->maxNbLit < pBVar16 + uVar9) {
LAB_001c6ec3:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a0,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar17) {
LAB_001c6ee2:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x2a1,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (local_50 < piVar17) {
      ZSTD_safecopyLiterals(pBVar16,(BYTE *)local_98,(BYTE *)piVar17,(BYTE *)local_50);
LAB_001c6bd0:
      seqStore->lit = seqStore->lit + uVar9;
      if (0xffff < uVar9) {
        if (seqStore->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2b2,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)(local_98 + 2);
      *(undefined8 *)pBVar16 = *(undefined8 *)local_98;
      *(undefined8 *)(pBVar16 + 8) = uVar3;
      pBVar16 = seqStore->lit;
      if (0x10 < uVar9) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar16 + 0x10 + (-0x10 - (long)(local_98 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                        ,0xe9,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar3 = *(undefined8 *)(local_98 + 6);
        *(undefined8 *)(pBVar16 + 0x10) = *(undefined8 *)(local_98 + 4);
        *(undefined8 *)(pBVar16 + 0x18) = uVar3;
        if (0x20 < (long)uVar9) {
          lVar12 = 0;
          do {
            puVar1 = (undefined8 *)((long)local_98 + lVar12 + 0x20);
            uVar3 = puVar1[1];
            pBVar15 = pBVar16 + lVar12 + 0x20;
            *(undefined8 *)pBVar15 = *puVar1;
            *(undefined8 *)(pBVar15 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)local_98 + lVar12 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar15 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar15 + 0x18) = uVar3;
            lVar12 = lVar12 + 0x20;
          } while (pBVar15 + 0x20 < pBVar16 + uVar9);
        }
        goto LAB_001c6bd0;
      }
      seqStore->lit = pBVar16 + uVar9;
    }
    psVar19 = seqStore->sequences;
    psVar19->litLength = (U16)uVar9;
    psVar19->offBase = (U32)uVar13;
    if (uVar8 < 3) {
LAB_001c6ea4:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,700,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar8 - 3) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c6f01:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2bf,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar19->mlBase = (U16)(uVar8 - 3);
    psVar19 = psVar19 + 1;
    seqStore->sequences = psVar19;
    if (local_a8->lazySkipping != 0) {
      local_a8->lazySkipping = 0;
    }
    uVar6 = local_b4;
    for (ip = (int *)((long)piVar17 + uVar8); uVar5 = uVar6, piVar10 = ip, ms = local_a8,
        ip <= local_58; ip = (int *)((long)ip + sVar7 + 4)) {
      uVar6 = ((int)ip - (int)local_78) - uVar5;
      pBVar16 = local_78;
      if (uVar6 < (uint)local_b0) {
        pBVar16 = local_48;
      }
      if ((0xfffffffc < uVar6 - (uint)local_b0) || (*(int *)(pBVar16 + uVar6) != *ip)) break;
      piVar10 = iEnd;
      if (uVar6 < (uint)local_b0) {
        piVar10 = local_88;
      }
      sVar7 = ZSTD_count_2segments
                        ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar16 + uVar6) + 4),(BYTE *)iEnd,
                         (BYTE *)piVar10,local_90);
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c6e66;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c6e85;
      pBVar16 = seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < pBVar16) goto LAB_001c6ec3;
      if (iEnd < ip) goto LAB_001c6ee2;
      if (local_50 < ip) {
        ZSTD_safecopyLiterals(pBVar16,(BYTE *)ip,(BYTE *)ip,(BYTE *)local_50);
      }
      else {
        uVar3 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar16 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar16 + 8) = uVar3;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (sVar7 + 4 < 3) goto LAB_001c6ea4;
      if (0xffff < sVar7 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6f01;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(sVar7 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      uVar6 = local_cc;
      local_cc = uVar5;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 2, ZSTD_dedicatedDictSearch);
}